

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTests.c
# Opt level: O2

void runUtilTests(void)

{
  uint __line;
  _Bool _Var1;
  SkeinSize_t SVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t size;
  char *__function;
  char *__assertion;
  arguments a1;
  arguments a3;
  arguments a2;
  
  printf("testIsGreaterThanThreeBlocks() ");
  a1.state_size = Skein256;
  a1.file_size = 0;
  a2.state_size = Skein256;
  a3.state_size = Skein256;
  a2.file_size = 0x60;
  a3.file_size = 0x61;
  _Var1 = isGreaterThanThreeBlocks(&a1);
  if (_Var1) {
    __assertion = "!isGreaterThanThreeBlocks(&a1)";
    __function = "void testIsGreaterThanThreeBlocks()";
    __line = 0xd;
  }
  else {
    _Var1 = isGreaterThanThreeBlocks(&a2);
    if (_Var1) {
      __assertion = "!isGreaterThanThreeBlocks(&a2)";
      __function = "void testIsGreaterThanThreeBlocks()";
      __line = 0xe;
    }
    else {
      _Var1 = isGreaterThanThreeBlocks(&a3);
      if (_Var1) {
        a1.state_size = Skein512;
        a1.file_size = 0;
        a2.state_size = Skein512;
        a3.state_size = Skein512;
        a2.file_size = 0xc0;
        a3.file_size = 0xc1;
        _Var1 = isGreaterThanThreeBlocks(&a1);
        if (_Var1) {
          __assertion = "!isGreaterThanThreeBlocks(&a1)";
          __function = "void testIsGreaterThanThreeBlocks()";
          __line = 0x15;
        }
        else {
          _Var1 = isGreaterThanThreeBlocks(&a2);
          if (_Var1) {
            __assertion = "!isGreaterThanThreeBlocks(&a2)";
            __function = "void testIsGreaterThanThreeBlocks()";
            __line = 0x16;
          }
          else {
            _Var1 = isGreaterThanThreeBlocks(&a3);
            if (_Var1) {
              a1.state_size = Skein1024;
              a1.file_size = 0;
              a2.state_size = Skein1024;
              a3.state_size = Skein1024;
              a2.file_size = 0x180;
              a3.file_size = 0x181;
              _Var1 = isGreaterThanThreeBlocks(&a1);
              if (_Var1) {
                __assertion = "!isGreaterThanThreeBlocks(&a1)";
                __function = "void testIsGreaterThanThreeBlocks()";
                __line = 0x1d;
              }
              else {
                _Var1 = isGreaterThanThreeBlocks(&a2);
                if (_Var1) {
                  __assertion = "!isGreaterThanThreeBlocks(&a2)";
                  __function = "void testIsGreaterThanThreeBlocks()";
                  __line = 0x1e;
                }
                else {
                  _Var1 = isGreaterThanThreeBlocks(&a3);
                  if (_Var1) {
                    puts("passed");
                    printf("testValidSize() ");
                    _Var1 = validSize(0x100);
                    if (_Var1) {
                      _Var1 = validSize(0x200);
                      if (_Var1) {
                        _Var1 = validSize(0x400);
                        if (_Var1) {
                          _Var1 = validSize(0x100);
                          if (_Var1) {
                            _Var1 = validSize(0x200);
                            if (_Var1) {
                              _Var1 = validSize(0x400);
                              if (_Var1) {
                                _Var1 = validSize(0);
                                if (_Var1) {
                                  __assertion = "!validSize(0)";
                                  __function = "void testValidSize()";
                                  __line = 0x2f;
                                }
                                else {
                                  _Var1 = validSize(0xe0);
                                  if (_Var1) {
                                    __assertion = "!validSize(224)";
                                    __function = "void testValidSize()";
                                    __line = 0x30;
                                  }
                                  else {
                                    _Var1 = validSize(0x80);
                                    if (_Var1) {
                                      __assertion = "!validSize(128)";
                                      __function = "void testValidSize()";
                                      __line = 0x31;
                                    }
                                    else {
                                      puts("passed");
                                      printf("testGetSkeinSize() ");
                                      a1.password._0_4_ = 0;
                                      a1.key_file = (uint8_t *)0x0;
                                      SVar2 = getSkeinSize((uint8_t *)&a1);
                                      if (SVar2 == Skein512) {
                                        a1.key_file = (uint8_t *)CONCAT62(a1.key_file._2_6_,0x30);
                                        SVar2 = getSkeinSize((uint8_t *)&a1);
                                        if (SVar2 == Skein512) {
                                          a1.key_file = (uint8_t *)
                                                        CONCAT44(a1.key_file._4_4_,0x363532);
                                          SVar2 = getSkeinSize((uint8_t *)&a1);
                                          if (SVar2 == Skein256) {
                                            a1.key_file = (uint8_t *)
                                                          CONCAT44(a1.key_file._4_4_,0x323135);
                                            SVar2 = getSkeinSize((uint8_t *)&a1);
                                            if (SVar2 == Skein512) {
                                              a1.key_file._4_4_ =
                                                   (uint)((ulong)a1.key_file >> 0x20) & 0xffffff00;
                                              a1.key_file = (uint8_t *)
                                                            CONCAT44(a1.key_file._4_4_,0x34323031);
                                              SVar2 = getSkeinSize((uint8_t *)&a1);
                                              if (SVar2 == Skein1024) {
                                                a1.key_file = (uint8_t *)
                                                              CONCAT26(a1.key_file._6_2_,
                                                                       0x6700000000);
                                                a1.key_file = (uint8_t *)
                                                              CONCAT44(a1.key_file._4_4_,0x72616c62)
                                                ;
                                                SVar2 = getSkeinSize((uint8_t *)&a1);
                                                if (SVar2 == Skein512) {
                                                  a1.key_file._4_4_ =
                                                       (uint)((ulong)a1.key_file >> 0x20) &
                                                       0xffffff00;
                                                  a1.key_file = (uint8_t *)
                                                                CONCAT44(a1.key_file._4_4_,
                                                                         0x45464153);
                                                  SVar2 = getSkeinSize((uint8_t *)&a1);
                                                  if (SVar2 == Skein256) {
                                                    a1.key_file._4_4_ =
                                                         (uint)((ulong)a1.key_file >> 0x20) &
                                                         0xffffff00;
                                                    a1.key_file = (uint8_t *)
                                                                  CONCAT44(a1.key_file._4_4_,
                                                                           0x65666153);
                                                    SVar2 = getSkeinSize((uint8_t *)&a1);
                                                    if (SVar2 == Skein256) {
                                                      a1.key_file._4_4_ =
                                                           (uint)((ulong)a1.key_file >> 0x20) &
                                                           0xffffff00;
                                                      a1.key_file = (uint8_t *)
                                                                    CONCAT44(a1.key_file._4_4_,
                                                                             0x65666173);
                                                      SVar2 = getSkeinSize((uint8_t *)&a1);
                                                      if (SVar2 == Skein256) {
                                                        a1.key_file = (uint8_t *)
                                                                      CONCAT17(a1.key_file._7_1_,
                                                                               0x455255000000);
                                                        a1.key_file = (uint8_t *)
                                                                      CONCAT44(a1.key_file._4_4_,
                                                                               0x55434553);
                                                        SVar2 = getSkeinSize((uint8_t *)&a1);
                                                        if (SVar2 == Skein512) {
                                                          a1.key_file = (uint8_t *)
                                                                        CONCAT17(a1.key_file._7_1_,
                                                                                 0x657275000000);
                                                          a1.key_file = (uint8_t *)
                                                                        CONCAT44(a1.key_file._4_4_,
                                                                                 0x75636553);
                                                          SVar2 = getSkeinSize((uint8_t *)&a1);
                                                          if (SVar2 == Skein512) {
                                                            a1.key_file = (uint8_t *)
                                                                          CONCAT17(a1.key_file._7_1_
                                                                                   ,0x657275000000);
                                                            a1.key_file = (uint8_t *)
                                                                          CONCAT44(a1.key_file._4_4_
                                                                                   ,0x75636573);
                                                            SVar2 = getSkeinSize((uint8_t *)&a1);
                                                            if (SVar2 == Skein512) {
                                                              a1.key_file = (uint8_t *)
                                                                            0x5250455255545546;
                                                              a1.password._0_4_ = 0x464f4f;
                                                              SVar2 = getSkeinSize((uint8_t *)&a1);
                                                              if (SVar2 == Skein1024) {
                                                                a1.key_file = (uint8_t *)
                                                                              0x7250657275747546;
                                                                a1.password._0_4_ = 0x666f6f;
                                                                SVar2 = getSkeinSize((uint8_t *)&a1)
                                                                ;
                                                                if (SVar2 == Skein1024) {
                                                                  a1.key_file = (uint8_t *)
                                                                                0x7270657275747566;
                                                                  a1.password._0_4_ = 0x666f6f;
                                                                  SVar2 = getSkeinSize((uint8_t *)
                                                                                       &a1);
                                                                  if (SVar2 == Skein1024) {
                                                                    puts("passed");
                                                                    printf("testBinToHex() ");
                                                                    puVar4 = binToHex((uint8_t *)0x0
                                                                                      ,
                                                  0xffffffffffffffff);
                                                  if (puVar4 == (uint8_t *)0x0) {
                                                    puVar4 = binToHex((uint8_t *)0x0,0);
                                                    if (puVar4 == (uint8_t *)0x0) {
                                                      puVar4 = (uint8_t *)calloc(0x2d,1);
                                                      memcpy(&a1,
                                                  "54686520717569636B2062726F776E20666F78206A756D7073206F76657220746865206C617A7920646F6721"
                                                  ,0x59);
                                                  builtin_memcpy(puVar4,
                                                  "The quick brown fox jumps over the lazy dog!",
                                                  0x2d);
                                                  iVar3 = strcmp((char *)puVar4,
                                                                                                                                  
                                                  "The quick brown fox jumps over the lazy dog!");
                                                  if (iVar3 == 0) {
                                                    size = strlen((char *)puVar4);
                                                    puVar4 = binToHex(puVar4,size);
                                                    iVar3 = strcmp((char *)puVar4,(char *)&a1);
                                                    if (iVar3 == 0) {
                                                      free(puVar4);
                                                      puts("passed");
                                                      return;
                                                    }
                                                    __assertion = 
                                                  "strcmp((char*)test_bfr, (char*)exp_hex) == 0";
                                                  __function = "void testBinToHex()";
                                                  __line = 0x6c;
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "strcmp((char*)test_bfr, \"The quick brown fox jumps over the lazy dog!\") == 0"
                                                  ;
                                                  __function = "void testBinToHex()";
                                                  __line = 0x6a;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "binToHex(NULL, 0) == NULL";
                                                    __function = "void testBinToHex()";
                                                    __line = 99;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "binToHex(NULL, SIZE_MAX) == NULL"
                                                    ;
                                                    __function = "void testBinToHex()";
                                                    __line = 0x62;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein1024";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x59;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein1024";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x57;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein1024";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x55;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein512";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x53;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein512";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x51;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein512";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x4f;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein256";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x4d;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein256";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x4b;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "getSkeinSize(test_key) == Skein256";
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x49;
                                                  }
                                                }
                                                else {
                                                  __assertion = "getSkeinSize(test_key) == Skein512"
                                                  ;
                                                  __function = "void testGetSkeinSize()";
                                                  __line = 0x47;
                                                }
                                              }
                                              else {
                                                __assertion = "getSkeinSize(test_key) == Skein1024";
                                                __function = "void testGetSkeinSize()";
                                                __line = 0x45;
                                              }
                                            }
                                            else {
                                              __assertion = "getSkeinSize(test_key) == Skein512";
                                              __function = "void testGetSkeinSize()";
                                              __line = 0x43;
                                            }
                                          }
                                          else {
                                            __assertion = "getSkeinSize(test_key) == Skein256";
                                            __function = "void testGetSkeinSize()";
                                            __line = 0x41;
                                          }
                                        }
                                        else {
                                          __assertion = "getSkeinSize(test_key) == Skein512";
                                          __function = "void testGetSkeinSize()";
                                          __line = 0x3f;
                                        }
                                      }
                                      else {
                                        __assertion = "getSkeinSize(test_key) == Skein512";
                                        __function = "void testGetSkeinSize()";
                                        __line = 0x3d;
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                __assertion = "validSize(Threefish1024)";
                                __function = "void testValidSize()";
                                __line = 0x2d;
                              }
                            }
                            else {
                              __assertion = "validSize(Threefish512)";
                              __function = "void testValidSize()";
                              __line = 0x2c;
                            }
                          }
                          else {
                            __assertion = "validSize(Threefish256)";
                            __function = "void testValidSize()";
                            __line = 0x2b;
                          }
                        }
                        else {
                          __assertion = "validSize(Skein1024)";
                          __function = "void testValidSize()";
                          __line = 0x2a;
                        }
                      }
                      else {
                        __assertion = "validSize(Skein512)";
                        __function = "void testValidSize()";
                        __line = 0x29;
                      }
                    }
                    else {
                      __assertion = "validSize(Skein256)";
                      __function = "void testValidSize()";
                      __line = 0x28;
                    }
                  }
                  else {
                    __assertion = "isGreaterThanThreeBlocks(&a3)";
                    __function = "void testIsGreaterThanThreeBlocks()";
                    __line = 0x1f;
                  }
                }
              }
            }
            else {
              __assertion = "isGreaterThanThreeBlocks(&a3)";
              __function = "void testIsGreaterThanThreeBlocks()";
              __line = 0x17;
            }
          }
        }
      }
      else {
        __assertion = "isGreaterThanThreeBlocks(&a3)";
        __function = "void testIsGreaterThanThreeBlocks()";
        __line = 0xf;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/utilTests.c"
                ,__line,__function);
}

Assistant:

static void testIsGreaterThanThreeBlocks()
{
    printf("testIsGreaterThanThreeBlocks() ");

    arguments a1, a2, a3;

    a1.state_size = Skein256; a2.state_size = Skein256; a3.state_size = Skein256;
    a1.file_size = 0;
    a2.file_size = (Skein256/8)*3;
    a3.file_size = ((Skein256/8)*3)+1;
    assert(!isGreaterThanThreeBlocks(&a1));
    assert(!isGreaterThanThreeBlocks(&a2));
    assert(isGreaterThanThreeBlocks(&a3));

    a1.state_size = Skein512; a2.state_size = Skein512; a3.state_size = Skein512;
    a1.file_size = 0;
    a2.file_size = (Skein512/8)*3;
    a3.file_size = ((Skein512/8)*3)+1;
    assert(!isGreaterThanThreeBlocks(&a1));
    assert(!isGreaterThanThreeBlocks(&a2));
    assert(isGreaterThanThreeBlocks(&a3));

    a1.state_size = Skein1024; a2.state_size = Skein1024; a3.state_size = Skein1024;
    a1.file_size = 0;
    a2.file_size = (Skein1024/8)*3;
    a3.file_size = ((Skein1024/8)*3)+1;
    assert(!isGreaterThanThreeBlocks(&a1));
    assert(!isGreaterThanThreeBlocks(&a2));
    assert(isGreaterThanThreeBlocks(&a3));

    printf("passed\n");
}